

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP5Writer::AsyncWriteDataCleanup_EveryoneWrites(BP5Writer *this)

{
  TokenChain<unsigned_long> *this_00;
  pointer pCVar1;
  AsyncWriteInfo *pAVar2;
  
  pAVar2 = this->m_AsyncWriteInfo;
  this_00 = pAVar2->tokenChain;
  if (this_00 != (TokenChain<unsigned_long> *)0x0) {
    shm::TokenChain<unsigned_long>::~TokenChain(this_00);
    operator_delete(this_00);
    pAVar2 = this->m_AsyncWriteInfo;
    if (pAVar2 == (AsyncWriteInfo *)0x0) {
      pAVar2 = (AsyncWriteInfo *)0x0;
      goto LAB_0048457a;
    }
  }
  pCVar1 = (pAVar2->expectedComputationBlocks).
           super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1);
  }
  helper::Comm::~Comm(&pAVar2->comm_chain);
LAB_0048457a:
  operator_delete(pAVar2);
  this->m_AsyncWriteInfo = (AsyncWriteInfo *)0x0;
  return;
}

Assistant:

void BP5Writer::AsyncWriteDataCleanup_EveryoneWrites()
{
    if (m_AsyncWriteInfo->tokenChain)
    {
        delete m_AsyncWriteInfo->tokenChain;
    }
    delete m_AsyncWriteInfo;
    m_AsyncWriteInfo = nullptr;
}